

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O2

ObjectSplit * __thiscall
embree::avx::
HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
sequential_object_find
          (ObjectSplit *__return_storage_ptr__,
          HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
          *this,PrimInfoExtRange *set,size_t logBlockSize,SplitInfo *info)

{
  int *piVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ObjectSplit *s;
  int iVar16;
  int iVar17;
  undefined1 (*pauVar18) [16];
  size_t sVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  uint *puVar25;
  PrimRef *pPVar26;
  size_t sVar27;
  ulong uVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar34;
  float fVar35;
  undefined1 auVar36 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  ObjectBinner binner;
  vuint4 rCounts [32];
  vfloat4 rAreas [32];
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 local_12f0;
  undefined8 uStack_12e8;
  undefined1 local_12d0 [16];
  undefined1 local_12c0 [16];
  undefined1 auStack_12b0 [16];
  undefined1 auStack_12a0 [16];
  undefined1 local_1290 [16];
  undefined1 local_1280 [16];
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [2976];
  undefined1 auStack_690 [16];
  uint local_680 [2];
  undefined8 auStack_678 [61];
  undefined1 auStack_490 [32];
  undefined1 auStack_470 [480];
  undefined8 uStack_290;
  float afStack_288 [6];
  float afStack_270 [144];
  
  auVar36._8_4_ = 0x7f800000;
  auVar36._0_8_ = 0x7f8000007f800000;
  auVar36._12_4_ = 0x7f800000;
  auVar38._8_4_ = 0xff800000;
  auVar38._0_8_ = 0xff800000ff800000;
  auVar38._12_4_ = 0xff800000;
  puVar25 = local_680;
  for (lVar22 = 0x50; lVar22 != 0xc50; lVar22 = lVar22 + 0x60) {
    *(undefined1 (*) [16])(local_1290 + lVar22) = auVar36;
    *(undefined1 (*) [16])(local_1280 + lVar22) = auVar38;
    *(undefined1 (*) [16])(auStack_12b0 + lVar22) = auVar36;
    *(undefined1 (*) [16])(auStack_12a0 + lVar22) = auVar38;
    *(undefined1 (*) [16])(local_12d0 + lVar22) = auVar36;
    *(undefined1 (*) [16])(local_12c0 + lVar22) = auVar38;
    puVar25[0] = 0;
    puVar25[1] = 0;
    puVar25[2] = 0;
    puVar25[3] = 0;
    puVar25 = puVar25 + 4;
  }
  uVar8 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  uVar9 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  fVar35 = (float)(uVar8 - uVar9) * 0.05 + 4.0;
  uVar23 = (ulong)fVar35;
  uVar23 = (long)(fVar35 - 9.223372e+18) & (long)uVar23 >> 0x3f | uVar23;
  uVar24 = 0x20;
  if (uVar23 < 0x20) {
    uVar24 = uVar23;
  }
  auVar3 = *(undefined1 (*) [16])(set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128;
  auVar42 = vsubps_avx((undefined1  [16])(set->super_CentGeomBBox3fa).centBounds.upper.field_0,
                       auVar3);
  auVar41._8_4_ = 0x704ec3d;
  auVar41._0_8_ = 0x704ec3d0704ec3d;
  auVar41._12_4_ = 0x704ec3d;
  auVar44 = vmaxps_avx(auVar41,auVar42);
  auVar42 = vcmpps_avx(auVar44,auVar41,6);
  auVar41 = vshufps_avx(ZEXT416((uint)((float)(long)uVar24 * 0.99)),
                        ZEXT416((uint)((float)(long)uVar24 * 0.99)),0);
  auVar44 = vdivps_avx(auVar41,auVar44);
  local_1290 = vandps_avx(auVar42,auVar44);
  uVar28 = uVar8 - uVar9;
  if (uVar28 != 0) {
    pPVar26 = this->prims0 + uVar9;
    auVar42 = vpshufd_avx(ZEXT416((int)uVar24 - 1),0);
    uVar20 = 0;
    while( true ) {
      fVar35 = local_1290._0_4_;
      fVar11 = local_1290._4_4_;
      fVar12 = local_1290._8_4_;
      fVar13 = local_1290._12_4_;
      if (uVar28 - 1 <= uVar20) break;
      aVar4 = (pPVar26->lower).field_0.field_1;
      aVar5 = (pPVar26->upper).field_0.field_1;
      aVar6 = pPVar26[1].lower.field_0.field_1;
      aVar7 = pPVar26[1].upper.field_0.field_1;
      auVar39._0_4_ = aVar4.x + aVar5.x;
      auVar39._4_4_ = aVar4.y + aVar5.y;
      auVar39._8_4_ = aVar4.z + aVar5.z;
      auVar39._12_4_ = aVar4.field_3.w + aVar5.field_3.w;
      auVar44 = vsubps_avx(auVar39,auVar3);
      auVar48._0_4_ = auVar44._0_4_ * fVar35;
      auVar48._4_4_ = auVar44._4_4_ * fVar11;
      auVar48._8_4_ = auVar44._8_4_ * fVar12;
      auVar48._12_4_ = auVar44._12_4_ * fVar13;
      auVar44 = vroundps_avx(auVar48,1);
      auVar44 = vcvtps2dq_avx(auVar44);
      auVar44 = vpminsd_avx(auVar44,auVar42);
      auVar45 = vpmaxsd_avx(auVar44,ZEXT816(0) << 0x20);
      auVar49._0_4_ = aVar6.x + aVar7.x;
      auVar49._4_4_ = aVar6.y + aVar7.y;
      auVar49._8_4_ = aVar6.z + aVar7.z;
      auVar49._12_4_ = aVar6.field_3.w + aVar7.field_3.w;
      auVar44 = vsubps_avx(auVar49,auVar3);
      auVar32._0_4_ = auVar44._0_4_ * fVar35;
      auVar32._4_4_ = auVar44._4_4_ * fVar11;
      auVar32._8_4_ = auVar44._8_4_ * fVar12;
      auVar32._12_4_ = auVar44._12_4_ * fVar13;
      auVar44 = vroundps_avx(auVar32,1);
      auVar44 = vcvtps2dq_avx(auVar44);
      lVar21 = CONCAT44((int)(uVar23 >> 0x20),auVar45._0_4_);
      lVar22 = lVar21 * 0x60;
      auVar41 = vminps_avx(*(undefined1 (*) [16])(local_1280 + lVar22),(undefined1  [16])aVar4);
      *(undefined1 (*) [16])(local_1280 + lVar22) = auVar41;
      auVar41 = vmaxps_avx(*(undefined1 (*) [16])(local_1270 + lVar22),(undefined1  [16])aVar5);
      *(undefined1 (*) [16])(local_1270 + lVar22) = auVar41;
      lVar22 = (ulong)auVar45._4_4_ * 0x60;
      auVar41 = vminps_avx(*(undefined1 (*) [16])(local_1260 + lVar22),(undefined1  [16])aVar4);
      *(undefined1 (*) [16])(local_1260 + lVar22) = auVar41;
      auVar41 = vmaxps_avx(*(undefined1 (*) [16])(local_1250 + lVar22),(undefined1  [16])aVar5);
      *(undefined1 (*) [16])(local_1250 + lVar22) = auVar41;
      lVar22 = (ulong)auVar45._8_4_ * 0x60;
      auVar41 = vminps_avx(*(undefined1 (*) [16])(local_1240 + lVar22),(undefined1  [16])aVar4);
      *(undefined1 (*) [16])(local_1240 + lVar22) = auVar41;
      auVar41 = vmaxps_avx(*(undefined1 (*) [16])(local_1230 + lVar22),(undefined1  [16])aVar5);
      *(undefined1 (*) [16])(local_1230 + lVar22) = auVar41;
      puVar25 = local_680 + lVar21 * 4;
      *puVar25 = *puVar25 + 1;
      piVar1 = (int *)((long)auStack_678 + (ulong)auVar45._4_4_ * 0x10 + -4);
      *piVar1 = *piVar1 + 1;
      *(int *)(auStack_678 + (ulong)auVar45._8_4_ * 2) =
           *(int *)(auStack_678 + (ulong)auVar45._8_4_ * 2) + 1;
      auVar44 = vpminsd_avx(auVar44,auVar42);
      auVar41 = vpmaxsd_avx(auVar44,ZEXT816(0) << 0x20);
      lVar21 = CONCAT44((int)((ulong)(lVar21 * 0x10) >> 0x20),auVar41._0_4_);
      lVar22 = lVar21 * 0x60;
      auVar44 = vminps_avx(*(undefined1 (*) [16])(local_1280 + lVar22),(undefined1  [16])aVar6);
      *(undefined1 (*) [16])(local_1280 + lVar22) = auVar44;
      auVar44 = vmaxps_avx(*(undefined1 (*) [16])(local_1270 + lVar22),(undefined1  [16])aVar7);
      *(undefined1 (*) [16])(local_1270 + lVar22) = auVar44;
      lVar22 = (ulong)auVar41._4_4_ * 0x60;
      auVar44 = vminps_avx(*(undefined1 (*) [16])(local_1260 + lVar22),(undefined1  [16])aVar6);
      *(undefined1 (*) [16])(local_1260 + lVar22) = auVar44;
      auVar44 = vmaxps_avx(*(undefined1 (*) [16])(local_1250 + lVar22),(undefined1  [16])aVar7);
      *(undefined1 (*) [16])(local_1250 + lVar22) = auVar44;
      lVar22 = (ulong)auVar41._8_4_ * 0x60;
      auVar44 = vminps_avx(*(undefined1 (*) [16])(local_1240 + lVar22),(undefined1  [16])aVar6);
      *(undefined1 (*) [16])(local_1240 + lVar22) = auVar44;
      auVar44 = vmaxps_avx(*(undefined1 (*) [16])(local_1230 + lVar22),(undefined1  [16])aVar7);
      *(undefined1 (*) [16])(local_1230 + lVar22) = auVar44;
      uVar23 = lVar21 * 0x10;
      puVar25 = local_680 + lVar21 * 4;
      *puVar25 = *puVar25 + 1;
      piVar1 = (int *)((long)auStack_678 + (ulong)auVar41._4_4_ * 0x10 + -4);
      *piVar1 = *piVar1 + 1;
      *(int *)(auStack_678 + (ulong)auVar41._8_4_ * 2) =
           *(int *)(auStack_678 + (ulong)auVar41._8_4_ * 2) + 1;
      uVar20 = uVar20 + 2;
      pPVar26 = pPVar26 + 2;
    }
    if (uVar20 < uVar28) {
      aVar4 = (pPVar26->lower).field_0.field_1;
      aVar5 = (pPVar26->upper).field_0.field_1;
      auVar44._0_4_ = aVar4.x + aVar5.x;
      auVar44._4_4_ = aVar4.y + aVar5.y;
      auVar44._8_4_ = aVar4.z + aVar5.z;
      auVar44._12_4_ = aVar4.field_3.w + aVar5.field_3.w;
      auVar44 = vsubps_avx(auVar44,auVar3);
      auVar45._0_4_ = fVar35 * auVar44._0_4_;
      auVar45._4_4_ = fVar11 * auVar44._4_4_;
      auVar45._8_4_ = fVar12 * auVar44._8_4_;
      auVar45._12_4_ = fVar13 * auVar44._12_4_;
      auVar44 = vroundps_avx(auVar45,1);
      auVar44 = vcvtps2dq_avx(auVar44);
      auVar42 = vpminsd_avx(auVar44,auVar42);
      auVar44 = vpmaxsd_avx(auVar42,(undefined1  [16])0x0);
      lVar22 = CONCAT44((int)(uVar28 - 1 >> 0x20),auVar44._0_4_);
      lVar21 = lVar22 * 0x60;
      puVar25 = local_680 + lVar22 * 4;
      *puVar25 = *puVar25 + 1;
      auVar42 = vminps_avx(*(undefined1 (*) [16])(local_1280 + lVar21),(undefined1  [16])aVar4);
      *(undefined1 (*) [16])(local_1280 + lVar21) = auVar42;
      auVar42 = vmaxps_avx(*(undefined1 (*) [16])(local_1270 + lVar21),(undefined1  [16])aVar5);
      *(undefined1 (*) [16])(local_1270 + lVar21) = auVar42;
      lVar22 = (ulong)auVar44._4_4_ * 0x60;
      piVar1 = (int *)((long)auStack_678 + (ulong)auVar44._4_4_ * 0x10 + -4);
      *piVar1 = *piVar1 + 1;
      auVar42 = vminps_avx(*(undefined1 (*) [16])(local_1260 + lVar22),(undefined1  [16])aVar4);
      *(undefined1 (*) [16])(local_1260 + lVar22) = auVar42;
      auVar42 = vmaxps_avx(*(undefined1 (*) [16])(local_1250 + lVar22),(undefined1  [16])aVar5);
      *(undefined1 (*) [16])(local_1250 + lVar22) = auVar42;
      lVar22 = (ulong)auVar44._8_4_ * 0x60;
      *(int *)(auStack_678 + (ulong)auVar44._8_4_ * 2) =
           *(int *)(auStack_678 + (ulong)auVar44._8_4_ * 2) + 1;
      auVar42 = vminps_avx(*(undefined1 (*) [16])(local_1240 + lVar22),(undefined1  [16])aVar4);
      *(undefined1 (*) [16])(local_1240 + lVar22) = auVar42;
      auVar42 = vmaxps_avx(*(undefined1 (*) [16])(local_1230 + lVar22),(undefined1  [16])aVar5);
      *(undefined1 (*) [16])(local_1230 + lVar22) = auVar42;
    }
  }
  pauVar18 = (undefined1 (*) [16])(local_1290 + uVar24 * 0x60);
  lVar22 = uVar24 * 0x10;
  auVar43 = ZEXT1664((undefined1  [16])0x0);
  lVar21 = 0;
  uVar23 = uVar24;
  auVar45 = auVar36;
  auVar44 = auVar38;
  auVar41 = auVar36;
  auVar42 = auVar38;
  while (uVar23 = uVar23 - 1, uVar23 != 0) {
    auVar49 = vpaddd_avx(auVar43._0_16_,*(undefined1 (*) [16])(auStack_690 + lVar21 + lVar22));
    auVar43 = ZEXT1664(auVar49);
    auVar41 = vminps_avx(auVar41,pauVar18[-5]);
    auVar42 = vmaxps_avx(auVar42,pauVar18[-4]);
    auVar45 = vminps_avx(auVar45,pauVar18[-3]);
    auVar32 = vsubps_avx(auVar42,auVar41);
    auVar44 = vmaxps_avx(auVar44,pauVar18[-2]);
    auVar33 = vsubps_avx(auVar44,auVar45);
    auVar39 = vinsertps_avx(auVar33,auVar32,0x4c);
    auVar48 = vshufpd_avx(auVar32,auVar32,1);
    auVar48 = vinsertps_avx(auVar48,auVar33,0x9c);
    auVar32 = vunpcklps_avx(auVar32,auVar33);
    auVar33._0_4_ = auVar32._0_4_ * (auVar39._0_4_ + auVar48._0_4_) + auVar39._0_4_ * auVar48._0_4_;
    auVar33._4_4_ = auVar32._4_4_ * (auVar39._4_4_ + auVar48._4_4_) + auVar39._4_4_ * auVar48._4_4_;
    auVar33._8_4_ = auVar32._8_4_ * (auVar39._8_4_ + auVar48._8_4_) + auVar39._8_4_ * auVar48._8_4_;
    auVar33._12_4_ =
         auVar32._12_4_ * (auVar39._12_4_ + auVar48._12_4_) + auVar39._12_4_ * auVar48._12_4_;
    auVar36 = vminps_avx(auVar36,pauVar18[-1]);
    auVar38 = vmaxps_avx(auVar38,*pauVar18);
    uVar2 = vmovlps_avx(auVar33);
    *(undefined8 *)((long)&uStack_290 + lVar21 + lVar22) = uVar2;
    auVar32 = vsubps_avx(auVar38,auVar36);
    auVar39 = vmovshdup_avx(auVar32);
    auVar48 = vshufpd_avx(auVar32,auVar32,1);
    *(float *)((long)afStack_288 + lVar21 + lVar22) =
         auVar32._0_4_ * (auVar39._0_4_ + auVar48._0_4_) + auVar39._0_4_ * auVar48._0_4_;
    *(undefined4 *)((long)afStack_288 + lVar21 + lVar22 + 4) = 0;
    *(undefined1 (*) [16])(auStack_490 + lVar21 + lVar22) = auVar49;
    pauVar18 = pauVar18 + -6;
    lVar21 = lVar21 + -0x10;
  }
  uVar23 = 0xffffffffffffffff;
  auVar48 = vpshufd_avx(ZEXT416((uint)~(-1 << ((byte)logBlockSize & 0x1f))),0);
  uVar28 = 1;
  auVar39 = ZEXT816(0) << 0x40;
  auVar42._8_4_ = 0xff800000;
  auVar42._0_8_ = 0xff800000ff800000;
  auVar42._12_4_ = 0xff800000;
  auVar46._8_8_ = 0x100000001;
  auVar46._0_8_ = 0x100000001;
  local_12c0._8_4_ = 0x7f800000;
  local_12c0._0_8_ = 0x7f8000007f800000;
  local_12c0._12_4_ = 0x7f800000;
  local_12d0 = ZEXT816(0) << 0x40;
  pauVar18 = (undefined1 (*) [16])local_1230;
  lVar22 = 0;
  auVar45 = local_12c0;
  auVar41 = local_12c0;
  auVar36 = auVar42;
  auVar44 = local_12c0;
  auVar38 = auVar42;
  while (uVar28 < uVar24) {
    auVar39 = vpaddd_avx(auVar39,*(undefined1 (*) [16])((long)auStack_678 + lVar22 + -8));
    auVar44 = vminps_avx(auVar44,pauVar18[-5]);
    auVar38 = vmaxps_avx(auVar38,pauVar18[-4]);
    auVar41 = vminps_avx(auVar41,pauVar18[-3]);
    auVar36 = vmaxps_avx(auVar36,pauVar18[-2]);
    auVar33 = vsubps_avx(auVar38,auVar44);
    auVar14 = vsubps_avx(auVar36,auVar41);
    auVar45 = vminps_avx(auVar45,pauVar18[-1]);
    auVar42 = vmaxps_avx(auVar42,*pauVar18);
    auVar15 = vsubps_avx(auVar42,auVar45);
    auVar49 = vshufps_avx(auVar33,auVar15,0x65);
    auVar49 = vblendps_avx(auVar49,auVar14,2);
    auVar32 = vshufps_avx(auVar33,auVar15,0x96);
    auVar10 = vinsertps_avx(auVar32,auVar14,0x90);
    auVar32 = vshufps_avx(auVar33,auVar15,0);
    auVar14 = vinsertps_avx(auVar32,auVar14,0x10);
    auVar32 = vpaddd_avx(auVar48,auVar39);
    auVar33 = vpsrld_avx(auVar32,ZEXT416((uint)logBlockSize));
    auVar32 = vpaddd_avx(auVar48,*(undefined1 (*) [16])(auStack_470 + lVar22));
    auVar30 = vpsrld_avx(auVar32,ZEXT416((uint)logBlockSize));
    auVar32 = vpsrad_avx(auVar33,0x1f);
    auVar47._8_8_ = 0x4f0000004f000000;
    auVar47._0_8_ = 0x4f0000004f000000;
    auVar15 = vpand_avx(auVar47,auVar32);
    auVar50._8_4_ = 0x7fffffff;
    auVar50._0_8_ = 0x7fffffff7fffffff;
    auVar50._12_4_ = 0x7fffffff;
    auVar32 = vpand_avx(auVar50,auVar33);
    auVar32 = vcvtdq2ps_avx(auVar32);
    auVar33 = vpsrad_avx(auVar30,0x1f);
    auVar47 = vpand_avx(auVar47,auVar33);
    auVar33 = vpand_avx(auVar30,auVar50);
    auVar33 = vcvtdq2ps_avx(auVar33);
    auVar30._0_4_ =
         (auVar14._0_4_ * (auVar10._0_4_ + auVar49._0_4_) + auVar10._0_4_ * auVar49._0_4_) *
         (auVar32._0_4_ + auVar15._0_4_) +
         (auVar33._0_4_ + auVar47._0_4_) * *(float *)((long)afStack_270 + lVar22);
    auVar30._4_4_ =
         (auVar14._4_4_ * (auVar10._4_4_ + auVar49._4_4_) + auVar10._4_4_ * auVar49._4_4_) *
         (auVar32._4_4_ + auVar15._4_4_) +
         (auVar33._4_4_ + auVar47._4_4_) * *(float *)((long)afStack_270 + lVar22 + 4);
    auVar30._8_4_ =
         (auVar14._8_4_ * (auVar10._8_4_ + auVar49._8_4_) + auVar10._8_4_ * auVar49._8_4_) *
         (auVar32._8_4_ + auVar15._8_4_) +
         (auVar33._8_4_ + auVar47._8_4_) * *(float *)((long)afStack_270 + lVar22 + 8);
    auVar30._12_4_ =
         (auVar14._12_4_ * (auVar10._12_4_ + auVar49._12_4_) + auVar10._12_4_ * auVar49._12_4_) *
         (auVar32._12_4_ + auVar15._12_4_) +
         (auVar33._12_4_ + auVar47._12_4_) * *(float *)((long)afStack_270 + lVar22 + 0xc);
    auVar49 = vcmpps_avx(auVar30,local_12c0,1);
    local_12d0 = vblendvps_avx(local_12d0,auVar46,auVar49);
    local_12c0 = vminps_avx(auVar30,local_12c0);
    uVar28 = uVar28 + 1;
    auVar46 = vpsubd_avx(auVar46,_DAT_01f46b70);
    lVar22 = lVar22 + 0x10;
    pauVar18 = pauVar18 + 6;
  }
  fVar35 = INFINITY;
  iVar16 = 0;
  local_12f0 = auVar3._0_8_;
  uStack_12e8 = auVar3._8_8_;
  for (uVar28 = 0; uVar28 != 3; uVar28 = uVar28 + 1) {
    if ((((*(float *)(local_1290 + uVar28 * 4) != 0.0) || (NAN(*(float *)(local_1290 + uVar28 * 4)))
         ) && (*(float *)(local_12c0 + uVar28 * 4) < fVar35)) &&
       (*(int *)(local_12d0 + uVar28 * 4) != 0)) {
      uVar23 = uVar28 & 0xffffffff;
      iVar16 = *(int *)(local_12d0 + uVar28 * 4);
      fVar35 = *(float *)(local_12c0 + uVar28 * 4);
    }
  }
  __return_storage_ptr__->sah = fVar35;
  iVar17 = (int)uVar23;
  __return_storage_ptr__->dim = iVar17;
  (__return_storage_ptr__->field_2).pos = iVar16;
  __return_storage_ptr__->data = 0;
  (__return_storage_ptr__->mapping).num = uVar24;
  *(undefined8 *)&(__return_storage_ptr__->mapping).ofs.field_0 = local_12f0;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) = uStack_12e8;
  local_1300 = local_1290._0_8_;
  uStack_12f8 = local_1290._8_8_;
  *(undefined8 *)&(__return_storage_ptr__->mapping).scale.field_0 = local_1300;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) = uStack_12f8;
  if (iVar17 == -1) {
    info->leftCount = SUB168(ZEXT816(0) << 0x20,0);
    info->rightCount = SUB168(ZEXT816(0) << 0x20,8);
    aVar37.m128[2] = INFINITY;
    aVar37._0_8_ = 0x7f8000007f800000;
    aVar37.m128[3] = INFINITY;
    (info->leftBounds).lower.field_0 = aVar37;
    aVar31.m128[2] = -INFINITY;
    aVar31._0_8_ = 0xff800000ff800000;
    aVar31.m128[3] = -INFINITY;
    aVar40 = aVar31;
  }
  else {
    uVar28 = (ulong)iVar16;
    lVar22 = (long)iVar17;
    puVar25 = local_680 + lVar22;
    pauVar18 = (undefined1 (*) [16])(local_1270 + lVar22 * 0x20);
    aVar31.m128[2] = -INFINITY;
    aVar31._0_8_ = 0xff800000ff800000;
    aVar31.m128[3] = -INFINITY;
    aVar34.m128[2] = INFINITY;
    aVar34._0_8_ = 0x7f8000007f800000;
    aVar34.m128[3] = INFINITY;
    sVar19 = 0;
    uVar23 = uVar28;
    while (bVar29 = uVar23 != 0, uVar23 = uVar23 - 1, bVar29) {
      sVar19 = sVar19 + *puVar25;
      aVar34.m128 = (__m128)vminps_avx(aVar34.m128,pauVar18[-1]);
      aVar31.m128 = (__m128)vmaxps_avx(aVar31.m128,*pauVar18);
      puVar25 = puVar25 + 4;
      pauVar18 = pauVar18 + 6;
    }
    puVar25 = (uint *)((long)auStack_678 + uVar28 * 0x10 + lVar22 * 4 + -8);
    pauVar18 = (undefined1 (*) [16])(local_1270 + uVar28 * 0x60 + lVar22 * 0x20);
    aVar40.m128[2] = -INFINITY;
    aVar40._0_8_ = 0xff800000ff800000;
    aVar40.m128[3] = -INFINITY;
    aVar37.m128[2] = INFINITY;
    aVar37._0_8_ = 0x7f8000007f800000;
    aVar37.m128[3] = INFINITY;
    sVar27 = 0;
    for (; uVar28 < uVar24; uVar28 = uVar28 + 1) {
      aVar37.m128 = (__m128)vminps_avx(aVar37.m128,pauVar18[-1]);
      aVar40.m128 = (__m128)vmaxps_avx(aVar40.m128,*pauVar18);
      sVar27 = sVar27 + *puVar25;
      puVar25 = puVar25 + 4;
      pauVar18 = pauVar18 + 6;
    }
    info->leftCount = sVar19;
    info->rightCount = sVar27;
    (info->leftBounds).lower.field_0 = aVar34;
  }
  (info->leftBounds).upper.field_0 = aVar31;
  (info->rightBounds).lower.field_0 = aVar37;
  (info->rightBounds).upper.field_0 = aVar40;
  return __return_storage_ptr__;
}

Assistant:

sequential_object_find(const PrimInfoExtRange& set, const size_t logBlockSize, SplitInfo &info)
        {
          ObjectBinner binner(empty); 
          const BinMapping<OBJECT_BINS> mapping(set);
          binner.bin(prims0,set.begin(),set.end(),mapping);
          ObjectSplit s = binner.best(mapping,logBlockSize);
          binner.getSplitInfo(mapping, s, info);
          return s;
        }